

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmn.c
# Opt level: O0

void cmn(cmn_t *cmn,mfcc_t **mfc,int32 varnorm,int32 n_frame)

{
  float *pfVar1;
  mfcc_t *pmVar2;
  float fVar3;
  double dVar4;
  int local_38;
  int local_34;
  int32 n_pos_frame;
  int32 f;
  int32 i;
  mfcc_t t;
  mfcc_t *mfcp;
  int32 n_frame_local;
  int32 varnorm_local;
  mfcc_t **mfc_local;
  cmn_t *cmn_local;
  
  if (mfc == (mfcc_t **)0x0) {
    __assert_fail("mfc != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/cmn.c"
                  ,0x6b,"void cmn(cmn_t *, mfcc_t **, int32, int32)");
  }
  if (0 < n_frame) {
    memset(cmn->cmn_mean,0,(long)cmn->veclen << 2);
    local_38 = 0;
    for (local_34 = 0; local_34 < n_frame; local_34 = local_34 + 1) {
      pfVar1 = (float *)mfc[local_34];
      if (0.0 < *pfVar1 || *pfVar1 == 0.0) {
        for (n_pos_frame = 0; n_pos_frame < cmn->veclen; n_pos_frame = n_pos_frame + 1) {
          cmn->cmn_mean[n_pos_frame] =
               (mfcc_t)(pfVar1[n_pos_frame] + (float)cmn->cmn_mean[n_pos_frame]);
        }
        local_38 = local_38 + 1;
      }
    }
    for (n_pos_frame = 0; n_pos_frame < cmn->veclen; n_pos_frame = n_pos_frame + 1) {
      cmn->cmn_mean[n_pos_frame] = (mfcc_t)((float)cmn->cmn_mean[n_pos_frame] / (float)local_38);
    }
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/cmn.c"
            ,0x85,"CMN: ");
    for (n_pos_frame = 0; n_pos_frame < cmn->veclen; n_pos_frame = n_pos_frame + 1) {
      err_msg(ERR_INFOCONT,(char *)0x0,0,"%5.2f ",(double)(float)cmn->cmn_mean[n_pos_frame]);
    }
    err_msg(ERR_INFOCONT,(char *)0x0,0,"\n");
    if (varnorm == 0) {
      for (local_34 = 0; local_34 < n_frame; local_34 = local_34 + 1) {
        pmVar2 = mfc[local_34];
        for (n_pos_frame = 0; n_pos_frame < cmn->veclen; n_pos_frame = n_pos_frame + 1) {
          pmVar2[n_pos_frame] =
               (mfcc_t)((float)pmVar2[n_pos_frame] - (float)cmn->cmn_mean[n_pos_frame]);
        }
      }
    }
    else {
      memset(cmn->cmn_var,0,(long)cmn->veclen << 2);
      for (local_34 = 0; local_34 < n_frame; local_34 = local_34 + 1) {
        pmVar2 = mfc[local_34];
        for (n_pos_frame = 0; n_pos_frame < cmn->veclen; n_pos_frame = n_pos_frame + 1) {
          fVar3 = (float)pmVar2[n_pos_frame] - (float)cmn->cmn_mean[n_pos_frame];
          cmn->cmn_var[n_pos_frame] = (mfcc_t)(fVar3 * fVar3 + (float)cmn->cmn_var[n_pos_frame]);
        }
      }
      for (n_pos_frame = 0; n_pos_frame < cmn->veclen; n_pos_frame = n_pos_frame + 1) {
        dVar4 = sqrt((double)n_frame / (double)(float)cmn->cmn_var[n_pos_frame]);
        cmn->cmn_var[n_pos_frame] = (mfcc_t)(float)dVar4;
      }
      for (local_34 = 0; local_34 < n_frame; local_34 = local_34 + 1) {
        pmVar2 = mfc[local_34];
        for (n_pos_frame = 0; n_pos_frame < cmn->veclen; n_pos_frame = n_pos_frame + 1) {
          pmVar2[n_pos_frame] =
               (mfcc_t)(((float)pmVar2[n_pos_frame] - (float)cmn->cmn_mean[n_pos_frame]) *
                       (float)cmn->cmn_var[n_pos_frame]);
        }
      }
    }
  }
  return;
}

Assistant:

void
cmn(cmn_t *cmn, mfcc_t ** mfc, int32 varnorm, int32 n_frame)
{
    mfcc_t *mfcp;
    mfcc_t t;
    int32 i, f;
    int32 n_pos_frame;

    assert(mfc != NULL);

    if (n_frame <= 0)
        return;

    /* If cmn->cmn_mean wasn't NULL, we need to zero the contents */
    memset(cmn->cmn_mean, 0, cmn->veclen * sizeof(mfcc_t));

    /* Find mean cep vector for this utterance */
    for (f = 0, n_pos_frame = 0; f < n_frame; f++) {
        mfcp = mfc[f];

        /* Skip zero energy frames */
        if (mfcp[0] < 0)
    	    continue;

        for (i = 0; i < cmn->veclen; i++) {
            cmn->cmn_mean[i] += mfcp[i];
        }

        n_pos_frame++;
    }

    for (i = 0; i < cmn->veclen; i++)
        cmn->cmn_mean[i] /= n_pos_frame;

    E_INFO("CMN: ");
    for (i = 0; i < cmn->veclen; i++)
        E_INFOCONT("%5.2f ", MFCC2FLOAT(cmn->cmn_mean[i]));
    E_INFOCONT("\n");
    if (!varnorm) {
        /* Subtract mean from each cep vector */
        for (f = 0; f < n_frame; f++) {
            mfcp = mfc[f];
            for (i = 0; i < cmn->veclen; i++)
                mfcp[i] -= cmn->cmn_mean[i];
        }
    }
    else {
        /* Scale cep vectors to have unit variance along each dimension, and subtract means */
        /* If cmn->cmn_var wasn't NULL, we need to zero the contents */
        memset(cmn->cmn_var, 0, cmn->veclen * sizeof(mfcc_t));

        for (f = 0; f < n_frame; f++) {
            mfcp = mfc[f];

            for (i = 0; i < cmn->veclen; i++) {
                t = mfcp[i] - cmn->cmn_mean[i];
                cmn->cmn_var[i] += MFCCMUL(t, t);
            }
        }
        for (i = 0; i < cmn->veclen; i++)
            /* Inverse Std. Dev, RAH added type case from sqrt */
            cmn->cmn_var[i] = FLOAT2MFCC(sqrt((float64)n_frame / MFCC2FLOAT(cmn->cmn_var[i])));

        for (f = 0; f < n_frame; f++) {
            mfcp = mfc[f];
            for (i = 0; i < cmn->veclen; i++)
                mfcp[i] = MFCCMUL((mfcp[i] - cmn->cmn_mean[i]), cmn->cmn_var[i]);
        }
    }
}